

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

char * __thiscall
google::protobuf::MessageLite::_InternalParse(MessageLite *this,char *ptr,ParseContext *ctx)

{
  ParseContext *pPVar1;
  char *p;
  MessageLite *pMVar2;
  bool bVar3;
  unsigned_short uVar4;
  uint32_t uVar5;
  TcParseTableBase *pTVar6;
  ulong uVar7;
  TailCallParseFunc p_Var8;
  TcParseTableBase *pTVar9;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *this_local;
  TcParseTableBase *local_88;
  ParseContext *local_80;
  char *local_78;
  MessageLite *local_70;
  char *local_68;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_60;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_58;
  TcFieldData data;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  
  local_88 = GetTcParseTable(this);
  local_88 = local_88 + 1;
  local_80 = ctx;
  local_78 = ptr;
  local_70 = this;
  while (bVar3 = internal::ParseContext::Done(local_80,&local_78), pMVar2 = local_70, p = local_78,
        pPVar1 = local_80, ((bVar3 ^ 0xffU) & 1) != 0) {
    internal::TcFieldData::TcFieldData((TcFieldData *)&this_local);
    pTVar9 = local_88;
    pTVar6 = local_88 + -1;
    uVar4 = internal::UnalignedLoad<unsigned_short>(p);
    uVar7 = (ulong)(int)((uint)uVar4 & (uint)pTVar9[-1].fast_idx_mask);
    if ((uVar7 & 7) != 0) {
      internal::protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   internal::TcParseTableBase::fast_entry(pTVar6,uVar7 >> 3);
    local_58.data =
         (ulong)uVar4 ^
         ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data.field_0 + 8))->data;
    p_Var8 = internal::TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data.field_0);
    local_60.data = local_58.data;
    local_78 = (*p_Var8)(pMVar2,p,pPVar1,(TcFieldData)local_58,pTVar6,0);
    if ((local_78 == (char *)0x0) ||
       (uVar5 = internal::EpsCopyInputStream::LastTag(&local_80->super_EpsCopyInputStream),
       uVar5 != 1)) break;
  }
  pTVar9 = local_88 + -1;
  if ((local_88[-1].field_0x9 & 1) == 0) {
    if (local_78 == (char *)0x0) {
      local_88 = pTVar9;
      internal::TcParser::VerifyHasBitConsistency(local_70,pTVar9);
    }
    local_68 = local_78;
  }
  else {
    pTVar6 = local_88 + -1;
    local_88 = pTVar9;
    local_68 = (*pTVar6->post_loop_handler)(local_70,local_78,local_80);
  }
  return local_68;
}

Assistant:

const char* MessageLite::_InternalParse(const char* ptr,
                                        internal::ParseContext* ctx) {
  return internal::TcParser::ParseLoop(this, ptr, ctx, GetTcParseTable());
}